

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

int __thiscall
UnifiedRegex::CharSet<char16_t>::GetCompactEntries(CharSet<char16_t> *this,uint max,Char *entries)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  uint i;
  ulong uVar6;
  
  if (4 < max) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x589,"(max <= MaxCompact)","max <= MaxCompact");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if ((this->rep).compact.countPlusOne - 1 < 5) {
    uVar3 = GetCompactLength(this);
    if (uVar3 < max) {
      max = uVar3;
    }
    for (uVar6 = 0; max != uVar6; uVar6 = uVar6 + 1) {
      uVar3 = GetCompactCharU(this,(uint)uVar6);
      entries[uVar6] = (Char)uVar3;
    }
    iVar4 = *(int *)&this->rep + -1;
  }
  else {
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int CharSet<char16>::GetCompactEntries(uint max, __out_ecount(max) Char* entries) const
    {
        Assert(max <= MaxCompact);
        if (!IsCompact())
            return -1;

        uint count = min(max, (uint)(this->GetCompactLength()));
        __analysis_assume(count <= max);
        for (uint i = 0; i < count; i++)
        {
            // Bug in oacr. it can't figure out count is less than or equal to max
#pragma warning(suppress: 22102)
            entries[i] = this->GetCompactChar(i);
        }
        return static_cast<int>(rep.compact.countPlusOne - 1);
    }